

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

RegisterList * reglist_insert(Context *ctx,RegisterList *prev,RegisterType regtype,int regnum)

{
  uint32 uVar1;
  uint32 uVar2;
  RegisterList *pRVar3;
  RegisterList *pRStack_38;
  uint32 val;
  RegisterList *item;
  uint32 newval;
  int regnum_local;
  RegisterType regtype_local;
  RegisterList *prev_local;
  Context *ctx_local;
  
  uVar1 = reg_to_ui32(regtype,regnum);
  _regnum_local = prev;
  for (pRStack_38 = prev->next; pRStack_38 != (RegisterList *)0x0; pRStack_38 = pRStack_38->next) {
    uVar2 = reg_to_ui32(pRStack_38->regtype,pRStack_38->regnum);
    if (uVar1 == uVar2) {
      return pRStack_38;
    }
    if (uVar1 < uVar2) break;
    _regnum_local = pRStack_38;
  }
  pRVar3 = (RegisterList *)Malloc(ctx,0x30);
  if (pRVar3 != (RegisterList *)0x0) {
    pRVar3->regtype = regtype;
    pRVar3->regnum = regnum;
    pRVar3->usage = MOJOSHADER_USAGE_UNKNOWN;
    pRVar3->index = 0;
    pRVar3->writemask = 0;
    pRVar3->misc = 0;
    pRVar3->written = 0;
    pRVar3->array = (VariableList *)0x0;
    pRVar3->next = _regnum_local->next;
    _regnum_local->next = pRVar3;
  }
  return pRVar3;
}

Assistant:

static RegisterList *reglist_insert(Context *ctx, RegisterList *prev,
                                    const RegisterType regtype,
                                    const int regnum)
{
    const uint32 newval = reg_to_ui32(regtype, regnum);
    RegisterList *item = prev->next;
    while (item != NULL)
    {
        const uint32 val = reg_to_ui32(item->regtype, item->regnum);
        if (newval == val)
            return item;  // already set, so we're done.
        else if (newval < val)  // insert it here.
            break;
        else // if (newval > val)
        {
            // keep going, we're not to the insertion point yet.
            prev = item;
            item = item->next;
        } // else
    } // while

    // we need to insert an entry after (prev).
    item = (RegisterList *) Malloc(ctx, sizeof (RegisterList));
    if (item != NULL)
    {
        item->regtype = regtype;
        item->regnum = regnum;
        item->usage = MOJOSHADER_USAGE_UNKNOWN;
        item->index = 0;
        item->writemask = 0;
        item->misc = 0;
        item->written = 0;
        item->array = NULL;
        item->next = prev->next;
        prev->next = item;
    } // if

    return item;
}